

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

string * __thiscall
flatbuffers::FlatCompiler::GetUsageString
          (string *__return_storage_ptr__,FlatCompiler *this,string *program_name)

{
  ostream *poVar1;
  size_t in_RCX;
  undefined8 extraout_RDX;
  size_t extraout_RDX_00;
  size_t max_col;
  size_t extraout_RDX_01;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  undefined1 auVar4 [16];
  string files_description;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"Usage: ");
  poVar1 = std::operator<<(poVar1,(string *)program_name);
  std::operator<<(poVar1," [OPTION]... FILE... [-- BINARY_FILE...]\n");
  auVar4._8_8_ = extraout_RDX;
  auVar4._0_8_ = language_options._24_8_;
  while (p_Var2 = auVar4._0_8_, p_Var2 != (_Rb_tree_node_base *)(language_options + 8)) {
    AppendOption((stringstream *)local_1b8,(FlatCOption *)(p_Var2 + 1),auVar4._8_8_,in_RCX);
    auVar4 = std::_Rb_tree_increment(p_Var2);
  }
  std::operator<<(local_1a8,"\n");
  max_col = extraout_RDX_00;
  for (lVar3 = 0; lVar3 != 0x2d00; lVar3 = lVar3 + 0x80) {
    AppendOption((stringstream *)local_1b8,(FlatCOption *)(flatc_options + lVar3),max_col,in_RCX);
    max_col = extraout_RDX_01;
  }
  std::operator<<(local_1a8,"\n");
  std::operator+(&bStack_1f8,
                 "FILEs may be schemas (must end in .fbs), binary schemas (must end in .bfbs) or JSON files (conforming to preceding schema). BINARY_FILEs after the -- must be binary flatbuffer format files. Output files are named using the base file name of the input, and written to the current directory or the path given by -o. example: "
                 ,program_name);
  std::operator+(&local_1d8,&bStack_1f8," -c -b schema1.fbs schema2.fbs data.json");
  std::__cxx11::string::~string((string *)&bStack_1f8);
  AppendTextWrappedString((stringstream *)local_1b8,&local_1d8,0,in_RCX);
  std::operator<<(local_1a8,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FlatCompiler::GetUsageString(
    const std::string &program_name) const {
  std::stringstream ss;
  ss << "Usage: " << program_name
     << " [OPTION]... FILE... [-- BINARY_FILE...]\n";

  for (const FlatCOption &option : language_options) {
    AppendOption(ss, option, 80, 25);
  }
  ss << "\n";

  for (const FlatCOption &option : flatc_options) {
    AppendOption(ss, option, 80, 25);
  }
  ss << "\n";

  std::string files_description =
      "FILEs may be schemas (must end in .fbs), binary schemas (must end in "
      ".bfbs) or JSON files (conforming to preceding schema). BINARY_FILEs "
      "after the -- must be binary flatbuffer format files. Output files are "
      "named using the base file name of the input, and written to the current "
      "directory or the path given by -o. example: " +
      program_name + " -c -b schema1.fbs schema2.fbs data.json";
  AppendTextWrappedString(ss, files_description, 80, 0);
  ss << "\n";
  return ss.str();
}